

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

void * __thiscall
kj::anon_unknown_8::DiskHandle::mmap
          (DiskHandle *this,void *__addr,size_t __len,int __prot,int __flags,int __fd,
          __off_t __offset)

{
  int __fd_00;
  int *piVar1;
  undefined4 in_register_0000000c;
  MmapRange MVar2;
  Fault local_48;
  Fault f;
  void *mapping;
  MmapRange range;
  uint64_t size_local;
  uint64_t offset_local;
  DiskHandle *this_local;
  
  MVar2 = getMmapRange(__len,CONCAT44(in_register_0000000c,__prot));
  range.offset = MVar2.size;
  __fd_00 = AutoCloseFd::operator_cast_to_int((AutoCloseFd *)__addr);
  mapping = (void *)MVar2.offset;
  f.exception = (Exception *)::mmap((void *)0x0,range.offset,1,1,__fd_00,(__off_t)mapping);
  if (f.exception == (Exception *)0xffffffffffffffff) {
    piVar1 = __errno_location();
    kj::_::Debug::Fault::Fault
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x160,*piVar1,"mmap","");
    kj::_::Debug::Fault::fatal(&local_48);
  }
  Array<const_unsigned_char>::Array
            ((Array<const_unsigned_char> *)this,
             (uchar *)((long)f.exception + (__len - (long)mapping)),
             CONCAT44(in_register_0000000c,__prot),
             (ArrayDisposer *)&(anonymous_namespace)::mmapDisposer);
  return this;
}

Assistant:

Array<const byte> mmap(uint64_t offset, uint64_t size) const {
    auto range = getMmapRange(offset, size);
    const void* mapping = ::mmap(NULL, range.size, PROT_READ, MAP_SHARED, fd, range.offset);
    if (mapping == MAP_FAILED) {
      KJ_FAIL_SYSCALL("mmap", errno);
    }
    return Array<const byte>(reinterpret_cast<const byte*>(mapping) + (offset - range.offset),
                             size, mmapDisposer);
  }